

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveExprNames(NameContext *pNC,Expr *pExpr)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  uint uVar4;
  int iVar5;
  Walker w;
  
  if (pExpr == (Expr *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar1 = pNC->ncFlags;
    pNC->ncFlags = uVar1 & 0xf7ff6fef;
    w.pParse = pNC->pParse;
    w.xExprCallback = resolveExprStep;
    pcVar3 = (_func_int_Walker_ptr_Select_ptr *)0x0;
    if ((uVar1 >> 0x13 & 1) == 0) {
      pcVar3 = resolveSelectStep;
    }
    w.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    iVar5 = (w.pParse)->nHeight + pExpr->nHeight;
    (w.pParse)->nHeight = iVar5;
    w.xSelectCallback = pcVar3;
    w.u.pNC = pNC;
    iVar5 = sqlite3ExprCheckHeight(w.pParse,iVar5);
    uVar4 = 1;
    if (iVar5 == 0) {
      sqlite3WalkExprNN(&w,pExpr);
      (w.pParse)->nHeight = (w.pParse)->nHeight - pExpr->nHeight;
      uVar2 = pNC->ncFlags;
      pExpr->flags = pExpr->flags | uVar2 & 0x8010;
      pNC->ncFlags = uVar1 & 0x8009010 | uVar2;
      if (pNC->nNcErr < 1) {
        uVar4 = (uint)(0 < (w.pParse)->nErr);
      }
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  Expr *pExpr             /* The expression to be analyzed. */
){
  int savedHasAgg;
  Walker w;

  if( pExpr==0 ) return SQLITE_OK;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = (pNC->ncFlags & NC_NoSelect) ? 0 : resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight += pExpr->nHeight;
  if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
    return SQLITE_ERROR;
  }
#endif
  assert( pExpr!=0 );
  sqlite3WalkExprNN(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
  w.pParse->nHeight -= pExpr->nHeight;
#endif
  assert( EP_Agg==NC_HasAgg );
  assert( EP_Win==NC_HasWin );
  testcase( pNC->ncFlags & NC_HasAgg );
  testcase( pNC->ncFlags & NC_HasWin );
  ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
  pNC->ncFlags |= savedHasAgg;
  return pNC->nNcErr>0 || w.pParse->nErr>0;
}